

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpk_algorithm.c
# Opt level: O3

void fpk_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  solver_state_a s;
  int local_110 [4];
  long local_100;
  long local_f8;
  long local_f0;
  
  setup_simple_state_a(&two_dof_robot_a,local_110);
  lVar1 = (long)local_110[0];
  if (0 < lVar1) {
    lVar3 = 0;
    lVar4 = 0;
    lVar2 = 0;
    do {
      kca_fpk(_two_dof_robot_c + lVar3 + 0x20,local_100 + lVar4);
      ga_pose_compose(local_100 + lVar4,_two_dof_robot_c + lVar3,local_f8 + lVar4);
      ga_pose_compose(local_f8 + lVar4,local_f0 + lVar4,local_f0 + lVar4 + 0x20);
      lVar1 = (long)local_110[0];
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 0x20;
      lVar3 = lVar3 + 0x60;
    } while (lVar2 < lVar1);
  }
  ga_pose_log(lVar1 * 0x20 + local_f0);
  return;
}

Assistant:

void fpk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);

        // i^X_0 = i^X_{i-1} {i-1}^X_0
        ga_pose_compose(&s.x_rel[i - 1], &s.x_tot[i - 1], &s.x_tot[i]);
    }

    ga_pose_log(&s.x_tot[s.nbody]);
}